

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O2

bool anon_unknown.dwarf_b14be0::InitializeSymbolTable
               (TString *builtIns,int version,EProfile profile,SpvVersion *spvVersion,
               EShLanguage language,EShSource source,TInfoSink *infoSink,TSymbolTable *symbolTable)

{
  undefined4 uVar1;
  undefined4 uVar2;
  SpvVersion spvVersion_00;
  string sourceEntryPointName;
  char cVar3;
  int iVar4;
  TParseContextBase *pc;
  undefined8 in_stack_fffffffffffff2e8;
  undefined8 uVar5;
  char *builtInShaders [2];
  size_t builtInLengths [2];
  ForbidIncluder includer;
  TInputScanner input;
  string local_c58 [32];
  TScanContext scanContext;
  TPpContext ppContext;
  TIntermediate intermediate;
  
  glslang::TIntermediate::TIntermediate(&intermediate,language,version,profile);
  uVar5._0_4_ = spvVersion->spv;
  uVar5._4_4_ = spvVersion->vulkanGlsl;
  uVar1 = spvVersion->vulkan;
  uVar2 = spvVersion->openGl;
  spvVersion_00.openGl = uVar2;
  spvVersion_00.vulkan = uVar1;
  intermediate.source = source;
  std::__cxx11::string::string<std::allocator<char>>(local_c58,"",(allocator<char> *)&ppContext);
  spvVersion_00.spv = (int)uVar5;
  spvVersion_00.vulkanGlsl = (int)((ulong)uVar5 >> 0x20);
  spvVersion_00.vulkanRelaxed = spvVersion->vulkanRelaxed;
  spvVersion_00._17_3_ = *(undefined3 *)&spvVersion->field_0x11;
  sourceEntryPointName._M_string_length = in_stack_fffffffffffff2e8;
  sourceEntryPointName._M_dataplus._M_p = (pointer)local_c58;
  sourceEntryPointName.field_2._M_allocated_capacity = (size_type)builtIns;
  sourceEntryPointName.field_2._8_8_ = uVar5;
  pc = CreateParseContext(symbolTable,&intermediate,version,profile,source,language,infoSink,
                          spvVersion_00,true,EShMsgDefault,true,sourceEntryPointName);
  std::__cxx11::string::_M_dispose();
  includer.super_Includer._vptr_Includer = (Includer)&PTR_includeSystem_00a5ab20;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,"",(allocator<char> *)&scanContext);
  glslang::TPpContext::TPpContext(&ppContext,pc,(string *)&input,&includer.super_Includer);
  std::__cxx11::string::_M_dispose();
  scanContext._vptr_TScanContext = (_func_int **)&PTR__TScanContext_00a5afe0;
  scanContext.afterType = false;
  scanContext.afterStruct = false;
  scanContext.field = false;
  scanContext.afterBuffer = false;
  pc->scanContext = &scanContext;
  pc->ppContext = &ppContext;
  scanContext.parseContext = pc;
  glslang::TSymbolTable::push(symbolTable);
  builtInShaders[0] = (builtIns->_M_dataplus)._M_p;
  builtInLengths[0] = builtIns->_M_string_length;
  if (builtInLengths[0] == 0) {
    cVar3 = '\x01';
  }
  else {
    glslang::TInputScanner::TInputScanner
              (&input,1,builtInShaders,builtInLengths,(char **)0x0,0,0,false);
    iVar4 = (*(pc->super_TParseVersions)._vptr_TParseVersions[0x3b])(pc,&ppContext,&input,0);
    cVar3 = (char)iVar4;
    if (cVar3 == '\0') {
      glslang::TInfoSinkBase::message
                (&infoSink->info,EPrefixInternalError,"Unable to parse built-ins");
      printf("Unable to parse built-ins\n%s\n",(infoSink->info).sink._M_dataplus._M_p);
      puts(builtInShaders[0]);
    }
    glslang::TInputScanner::~TInputScanner(&input);
  }
  glslang::TPpContext::~TPpContext(&ppContext);
  (*(pc->super_TParseVersions)._vptr_TParseVersions[1])(pc);
  glslang::TIntermediate::~TIntermediate(&intermediate);
  return (bool)cVar3;
}

Assistant:

bool InitializeSymbolTable(const TString& builtIns, int version, EProfile profile, const SpvVersion& spvVersion, EShLanguage language,
                           EShSource source, TInfoSink& infoSink, TSymbolTable& symbolTable)
{
    TIntermediate intermediate(language, version, profile);

    intermediate.setSource(source);

    std::unique_ptr<TParseContextBase> parseContext(CreateParseContext(symbolTable, intermediate, version, profile, source,
                                                                       language, infoSink, spvVersion, true, EShMsgDefault,
                                                                       true));

    TShader::ForbidIncluder includer;
    TPpContext ppContext(*parseContext, "", includer);
    TScanContext scanContext(*parseContext);
    parseContext->setScanContext(&scanContext);
    parseContext->setPpContext(&ppContext);

    //
    // Push the symbol table to give it an initial scope.  This
    // push should not have a corresponding pop, so that built-ins
    // are preserved, and the test for an empty table fails.
    //

    symbolTable.push();

    const char* builtInShaders[2];
    size_t builtInLengths[2];
    builtInShaders[0] = builtIns.c_str();
    builtInLengths[0] = builtIns.size();

    if (builtInLengths[0] == 0)
        return true;

    TInputScanner input(1, builtInShaders, builtInLengths);
    if (! parseContext->parseShaderStrings(ppContext, input) != 0) {
        infoSink.info.message(EPrefixInternalError, "Unable to parse built-ins");
        printf("Unable to parse built-ins\n%s\n", infoSink.info.c_str());
        printf("%s\n", builtInShaders[0]);

        return false;
    }

    return true;
}